

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse.c
# Opt level: O2

void pnga_bin_index(Integer g_bin,Integer g_cnt,Integer g_off,Integer *values,Integer *subs,
                   Integer n,Integer sortit)

{
  int *piVar1;
  uint uVar2;
  long lVar3;
  int iVar4;
  Integer g_a;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  void *pvVar9;
  ulong icode;
  void *pvVar10;
  uint uVar11;
  Integer IVar12;
  long lVar13;
  int left;
  int right;
  void *local_b0;
  int root;
  Integer nbin;
  int local_98;
  int lenmes;
  void *local_90;
  int up;
  Integer *local_80;
  Integer local_78;
  Integer *local_70;
  Integer local_68;
  Integer local_60;
  Integer local_58;
  ulong local_50;
  ulong local_48;
  Integer type;
  Integer ndim;
  
  local_80 = values;
  local_78 = n;
  local_70 = subs;
  local_68 = g_cnt;
  local_58 = g_off;
  pnga_inquire(g_bin,&type,&ndim,&nbin);
  if (ndim != 1) {
    pnga_error("ga_bin_index: 1-dim array required",ndim);
  }
  if ((0xf < type - 0x3e9U) || ((0x8003UL >> (type - 0x3e9U & 0x3f) & 1) == 0)) {
    pnga_error("ga_bin_index: not integer type",type);
  }
  IVar12 = nbin;
  local_b0 = calloc(nbin,4);
  if (local_b0 == (void *)0x0) {
    pnga_error("ga_binning:calloc failed",IVar12);
    IVar12 = nbin;
  }
  local_60 = g_bin;
  local_90 = malloc(IVar12 * 4);
  if (local_90 == (void *)0x0) {
    pnga_error("ga_binning:malloc failed",IVar12);
  }
  lVar8 = 0;
  lVar13 = 0;
  if (0 < local_78) {
    lVar13 = local_78;
  }
  for (; lVar13 != lVar8; lVar8 = lVar8 + 1) {
    lVar3 = local_70[lVar8];
    uVar11 = (uint)lVar3;
    if (((int)uVar11 < 1) || (nbin < (long)(ulong)(uVar11 & 0x7fffffff))) {
      pnga_error("wrong bin",(long)(int)uVar11);
    }
    piVar1 = (int *)((long)local_b0 + ((lVar3 << 0x20) + -0x100000000 >> 0x1e));
    *piVar1 = *piVar1 + 1;
  }
  uVar6 = 0;
  pvVar9 = local_90;
  pvVar10 = local_b0;
  while (g_a = local_58, IVar12 = local_60, (long)uVar6 < nbin) {
    local_48 = uVar6 + 2000;
    uVar11 = (int)nbin - (int)uVar6;
    if (local_48 < (ulong)nbin) {
      uVar11 = 2000;
    }
    icode = (ulong)uVar11;
    local_50 = uVar6;
    iVar5 = armci_msg_me();
    if (local_b0 == (void *)0x0) {
      pnga_error("sgai_bin_offset: NULL pointer",(long)(int)uVar11);
    }
    local_98 = iVar5;
    if (2000 < (int)uVar11) {
      pnga_error("sgai_bin_offset: >NWORK",icode);
    }
    iVar5 = uVar11 * 4;
    armci_msg_bintree(0x14d,&root,&up,&left,&right);
    if (-1 < left) {
      armci_msg_rcv(0x7d64,workL,iVar5,&lenmes,left);
    }
    if (right < 0) {
      if (left < 0) goto LAB_00140a99;
LAB_00140a77:
      uVar6 = 0;
      if (0 < (int)uVar11) {
        uVar6 = (ulong)uVar11;
      }
      for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        workL[uVar7] = workL[uVar7] + *(int *)((long)pvVar10 + uVar7 * 4);
      }
    }
    else {
      armci_msg_rcv(0x7d64,workR,iVar5,&lenmes,right);
      if ((right | left) < 0) {
        if (-1 < left) goto LAB_00140a77;
LAB_00140a99:
        uVar6 = 0;
        if (0 < (int)uVar11) {
          uVar6 = (ulong)uVar11;
        }
        for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          workL[uVar7] = *(int *)((long)pvVar10 + uVar7 * 4);
        }
      }
      else {
        uVar6 = 0;
        if (0 < (int)uVar11) {
          uVar6 = (ulong)uVar11;
        }
        for (uVar7 = 0; uVar6 != uVar7; uVar7 = uVar7 + 1) {
          workL[uVar7] = workL[uVar7] + *(int *)((long)pvVar10 + uVar7 * 4) + workR[uVar7];
        }
      }
    }
    iVar4 = local_98;
    if (up != -1 && local_98 != root) {
      armci_msg_snd(0x7d64,workL,iVar5,up);
    }
    if (up != -1 && iVar4 != root) {
      armci_msg_rcv(0x7d64,workL,iVar5,&lenmes,up);
    }
    if ((int)uVar11 < 1) {
      icode = 0;
    }
    for (uVar6 = 0; icode != uVar6; uVar6 = uVar6 + 1) {
      *(int *)((long)pvVar9 + uVar6 * 4) = workL[uVar6] - *(int *)((long)pvVar10 + uVar6 * 4);
    }
    if (-1 < right) {
      armci_msg_snd(0x7d64,(void *)((long)local_90 + local_50 * 4),iVar5,right);
    }
    if (-1 < left) {
      for (uVar6 = 0; icode != uVar6; uVar6 = uVar6 + 1) {
        workR[uVar6] = *(int *)((long)pvVar9 + uVar6 * 4) - workR[uVar6];
      }
      armci_msg_snd(0x7d64,workR,iVar5,left);
    }
    pvVar10 = (void *)((long)pvVar10 + 8000);
    pvVar9 = (void *)((long)pvVar9 + 8000);
    uVar6 = local_48;
  }
  uVar11 = 0;
  do {
    lVar13 = (long)(int)uVar11;
    if (local_78 <= lVar13) {
LAB_00140c81:
      free(local_90);
      free(local_b0);
      if (sortit == 0) {
        pnga_sync();
      }
      else {
        pnga_bin_sorter(IVar12,local_68,g_a);
      }
      return;
    }
    _left = local_70[lVar13];
    uVar2 = *(uint *)((long)local_b0 + _left * 4 + -4);
    pnga_get(g_a,(Integer *)&left,(Integer *)&left,&root,(Integer *)&left);
    lVar8 = (long)*(int *)((long)local_90 + _left * 4 + -4);
    _up = lVar8 + _root;
    _root = _root + lVar8 + 1;
    _up = _up + (int)uVar2;
    if (nbin < _root) {
      printf("Writing off end of bins array: index=%d elems=%d lo=%ld hi=%ld values=%ld nbin=%ld\n",
             (ulong)uVar11,(ulong)uVar2,_root,_up,(long)local_80 + lVar13,nbin);
      goto LAB_00140c81;
    }
    pnga_put(IVar12,(Integer *)&root,(Integer *)&up,local_80 + lVar13,(Integer *)&left);
    uVar11 = uVar11 + uVar2;
  } while( true );
}

Assistant:

void pnga_bin_index(Integer g_bin, Integer g_cnt, Integer g_off, 
                   Integer *values, Integer *subs, Integer n, Integer sortit)
{
int i, my_nbin=0;
int *all_bin_contrib, *offset;
Integer type, ndim, nbin;

    pnga_inquire(g_bin, &type, &ndim, &nbin);
    if(ndim !=1) pnga_error("ga_bin_index: 1-dim array required",ndim);
    if(type!= C_INT && type!=C_LONG && type!=C_LONGLONG)
       pnga_error("ga_bin_index: not integer type",type);

    all_bin_contrib = (int*)calloc(nbin,sizeof(int));
    if(!all_bin_contrib)pnga_error("ga_binning:calloc failed",nbin);
    offset = (int*)malloc(nbin*sizeof(int));
    if(!offset)pnga_error("ga_binning:malloc failed",nbin);

    /* count how many elements go to each bin */
    for(i=0; i< n; i++){
       int selected = subs[i];
       if(selected <1 || selected> nbin) pnga_error("wrong bin",selected);

       if(all_bin_contrib[selected-1] ==0) my_nbin++; /* new bin found */
       all_bin_contrib[selected-1]++;
    }

    /* process bins in chunks to match available buffer space */
    for(i=0; i<nbin; i+=NWORK){
        int cnbin = ((i+NWORK)<nbin) ? NWORK: nbin -i;
        sgai_bin_offset(SCOPE_ALL, all_bin_contrib+i, cnbin, offset+i);
    }

    for(i=0; i< n; ){
       Integer lo, hi;
       Integer selected = subs[i];
       int elems = all_bin_contrib[selected-1];

       pnga_get(g_off,&selected,&selected, &lo, &selected);
       lo += offset[selected-1]+1;
       hi = lo + elems -1;
/*
       printf("%d: elems=%d lo=%d sel=%d off=%d contrib=%d nbin=%d\n",pnga_nodeid(), elems, lo, selected,offset[selected-1],all_bin_contrib[0],nbin);
*/
       if(lo > nbin) {
	      printf("Writing off end of bins array: index=%d elems=%d lo=%ld hi=%ld values=%ld nbin=%ld\n",
                i,elems,(long)lo,(long)hi,(long)values+i,(long)nbin);
         break;   
       }else{
          pnga_put(g_bin, &lo, &hi, values+i, &selected); 
       }
       i+=elems;
    }
    
    free(offset);
    free(all_bin_contrib);

    if(sortit)pnga_bin_sorter(g_bin, g_cnt, g_off);
    else pnga_sync();
}